

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O1

Box * __thiscall
amrex::BoxArray::minimalBox(Box *__return_storage_ptr__,BoxArray *this,Long *npts_avg_box)

{
  IntVect *pIVar1;
  undefined8 uVar2;
  element_type *peVar3;
  undefined8 *puVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int dir_1;
  uint uVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  int dir;
  uint uVar18;
  long lVar19;
  IntVect IVar20;
  int local_54 [3];
  int local_48 [3];
  long *local_38;
  
  (__return_storage_ptr__->smallend).vect[0] = 1;
  (__return_storage_ptr__->smallend).vect[1] = 1;
  (__return_storage_ptr__->smallend).vect[2] = 1;
  __return_storage_ptr__->bigend = (int  [3])0x0;
  __return_storage_ptr__->btype = 0;
  peVar3 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  puVar4 = *(undefined8 **)
            &(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data;
  uVar18 = (int)((long)*(pointer *)
                        ((long)&(peVar3->m_abox).
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data + 8) - (long)puVar4 >> 2) * -0x49249249;
  local_38 = npts_avg_box;
  if ((int)uVar18 < 1) {
    lVar19 = 0;
  }
  else {
    uVar2 = *puVar4;
    uVar6 = puVar4[1];
    uVar7 = *(undefined8 *)((long)puVar4 + 0x14);
    *(undefined8 *)(__return_storage_ptr__->bigend).vect = *(undefined8 *)((long)puVar4 + 0xc);
    *(undefined8 *)((__return_storage_ptr__->bigend).vect + 2) = uVar7;
    *(undefined8 *)(__return_storage_ptr__->smallend).vect = uVar2;
    *(undefined8 *)((__return_storage_ptr__->smallend).vect + 2) = uVar6;
    puVar4 = *(undefined8 **)
              &(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data;
    lVar19 = (long)((*(int *)((long)puVar4 + 0x14) - *(int *)(puVar4 + 1)) + 1) *
             (long)(((int)*(undefined8 *)((long)puVar4 + 0xc) - (int)*puVar4) + 1) *
             (long)(((int)((ulong)*(undefined8 *)((long)puVar4 + 0xc) >> 0x20) -
                    (int)((ulong)*puVar4 >> 0x20)) + 1);
    if (uVar18 != 1) {
      lVar16 = (ulong)(uVar18 & 0x7fffffff) - 1;
      lVar15 = 0x1c;
      do {
        Box::minBox(__return_storage_ptr__,
                    (Box *)(*(long *)&(((this->m_ref).
                                        super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->m_abox).
                                      super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                      _M_impl.super__Vector_impl_data + lVar15));
        lVar5 = *(long *)&(((this->m_ref).
                            super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data;
        uVar2 = *(undefined8 *)(lVar5 + 0xc + lVar15);
        lVar19 = lVar19 + (long)((*(int *)(lVar5 + 0x14 + lVar15) - *(int *)(lVar5 + 8 + lVar15)) +
                                1) * (long)(((int)uVar2 - (int)*(undefined8 *)(lVar5 + lVar15)) + 1)
                          * (long)(((int)((ulong)uVar2 >> 0x20) -
                                   (int)((ulong)*(undefined8 *)(lVar5 + lVar15) >> 0x20)) + 1);
        lVar15 = lVar15 + 0x1c;
        lVar16 = lVar16 + -1;
      } while (lVar16 != 0);
    }
  }
  IVar20 = BATransformer::coarsen_ratio(&this->m_bat);
  iVar13 = IVar20.vect[2];
  local_48[0] = IVar20.vect[0];
  local_48[1] = IVar20.vect[1];
  local_48[2] = IVar20.vect[2];
  iVar8 = IVar20.vect[0];
  local_48[1] = IVar20.vect[1];
  if (iVar13 == 1 && (local_48[1] == 1 && iVar8 == 1)) goto LAB_005695f7;
  uVar9 = (__return_storage_ptr__->smallend).vect[0];
  if (iVar8 != 1) {
    if (iVar8 == 4) {
      if ((int)uVar9 < 0) {
        uVar9 = uVar9 + 1;
        uVar12 = -uVar9;
        if (0 < (int)uVar9) {
          uVar12 = uVar9;
        }
        uVar12 = uVar12 >> 2;
LAB_00569335:
        uVar9 = ~uVar12;
      }
      else {
        uVar9 = uVar9 >> 2;
      }
    }
    else if (iVar8 == 2) {
      if ((int)uVar9 < 0) {
        uVar9 = uVar9 + 1;
        uVar12 = -uVar9;
        if (0 < (int)uVar9) {
          uVar12 = uVar9;
        }
        uVar12 = uVar12 >> 1;
        goto LAB_00569335;
      }
      uVar9 = uVar9 >> 1;
    }
    else if ((int)uVar9 < 0) {
      iVar11 = uVar9 + 1;
      iVar10 = -iVar11;
      if (0 < iVar11) {
        iVar10 = iVar11;
      }
      uVar9 = ~(iVar10 / iVar8);
    }
    else {
      uVar9 = (int)uVar9 / iVar8;
    }
  }
  (__return_storage_ptr__->smallend).vect[0] = uVar9;
  uVar9 = (__return_storage_ptr__->smallend).vect[1];
  if (local_48[1] != 1) {
    if (local_48[1] == 4) {
      if ((int)uVar9 < 0) {
        uVar9 = uVar9 + 1;
        uVar12 = -uVar9;
        if (0 < (int)uVar9) {
          uVar12 = uVar9;
        }
        uVar12 = uVar12 >> 2;
LAB_00569398:
        uVar9 = ~uVar12;
      }
      else {
        uVar9 = uVar9 >> 2;
      }
    }
    else if (local_48[1] == 2) {
      if ((int)uVar9 < 0) {
        uVar9 = uVar9 + 1;
        uVar12 = -uVar9;
        if (0 < (int)uVar9) {
          uVar12 = uVar9;
        }
        uVar12 = uVar12 >> 1;
        goto LAB_00569398;
      }
      uVar9 = uVar9 >> 1;
    }
    else if ((int)uVar9 < 0) {
      iVar11 = uVar9 + 1;
      iVar10 = -iVar11;
      if (0 < iVar11) {
        iVar10 = iVar11;
      }
      uVar9 = ~(iVar10 / local_48[1]);
    }
    else {
      uVar9 = (int)uVar9 / local_48[1];
    }
  }
  (__return_storage_ptr__->smallend).vect[1] = uVar9;
  uVar9 = (__return_storage_ptr__->smallend).vect[2];
  if (iVar13 != 1) {
    if (iVar13 == 4) {
      if ((int)uVar9 < 0) {
        uVar9 = uVar9 + 1;
        uVar12 = -uVar9;
        if (0 < (int)uVar9) {
          uVar12 = uVar9;
        }
        uVar12 = uVar12 >> 2;
LAB_005693f9:
        uVar9 = ~uVar12;
      }
      else {
        uVar9 = uVar9 >> 2;
      }
    }
    else if (iVar13 == 2) {
      if ((int)uVar9 < 0) {
        uVar9 = uVar9 + 1;
        uVar12 = -uVar9;
        if (0 < (int)uVar9) {
          uVar12 = uVar9;
        }
        uVar12 = uVar12 >> 1;
        goto LAB_005693f9;
      }
      uVar9 = uVar9 >> 1;
    }
    else if ((int)uVar9 < 0) {
      iVar11 = uVar9 + 1;
      iVar10 = -iVar11;
      if (0 < iVar11) {
        iVar10 = iVar11;
      }
      uVar9 = ~(iVar10 / iVar13);
    }
    else {
      uVar9 = (int)uVar9 / iVar13;
    }
  }
  pIVar1 = &__return_storage_ptr__->bigend;
  (__return_storage_ptr__->smallend).vect[2] = uVar9;
  uVar9 = (__return_storage_ptr__->btype).itype;
  if (uVar9 == 0) {
    uVar9 = pIVar1->vect[0];
    if (iVar8 != 1) {
      if (iVar8 == 4) {
        if ((int)uVar9 < 0) {
          uVar9 = uVar9 + 1;
          uVar12 = -uVar9;
          if (0 < (int)uVar9) {
            uVar12 = uVar9;
          }
          uVar12 = uVar12 >> 2;
LAB_005696b0:
          uVar9 = ~uVar12;
        }
        else {
          uVar9 = uVar9 >> 2;
        }
      }
      else if (iVar8 == 2) {
        if ((int)uVar9 < 0) {
          uVar9 = uVar9 + 1;
          uVar12 = -uVar9;
          if (0 < (int)uVar9) {
            uVar12 = uVar9;
          }
          uVar12 = uVar12 >> 1;
          goto LAB_005696b0;
        }
        uVar9 = uVar9 >> 1;
      }
      else if ((int)uVar9 < 0) {
        iVar11 = uVar9 + 1;
        iVar10 = -iVar11;
        if (0 < iVar11) {
          iVar10 = iVar11;
        }
        uVar9 = ~(iVar10 / iVar8);
      }
      else {
        uVar9 = (int)uVar9 / iVar8;
      }
    }
    (__return_storage_ptr__->bigend).vect[0] = uVar9;
    uVar9 = (__return_storage_ptr__->bigend).vect[1];
    if (local_48[1] != 1) {
      if (local_48[1] == 4) {
        if ((int)uVar9 < 0) {
          uVar9 = uVar9 + 1;
          uVar12 = -uVar9;
          if (0 < (int)uVar9) {
            uVar12 = uVar9;
          }
          uVar12 = uVar12 >> 2;
LAB_00569714:
          uVar9 = ~uVar12;
        }
        else {
          uVar9 = uVar9 >> 2;
        }
      }
      else if (local_48[1] == 2) {
        if ((int)uVar9 < 0) {
          uVar9 = uVar9 + 1;
          uVar12 = -uVar9;
          if (0 < (int)uVar9) {
            uVar12 = uVar9;
          }
          uVar12 = uVar12 >> 1;
          goto LAB_00569714;
        }
        uVar9 = uVar9 >> 1;
      }
      else if ((int)uVar9 < 0) {
        iVar11 = uVar9 + 1;
        iVar10 = -iVar11;
        if (0 < iVar11) {
          iVar10 = iVar11;
        }
        uVar9 = ~(iVar10 / local_48[1]);
      }
      else {
        uVar9 = (int)uVar9 / local_48[1];
      }
    }
    (__return_storage_ptr__->bigend).vect[1] = uVar9;
    uVar9 = (__return_storage_ptr__->bigend).vect[2];
    if (iVar13 != 1) {
      if (iVar13 == 4) {
        if ((int)uVar9 < 0) {
          uVar9 = uVar9 + 1;
          uVar12 = -uVar9;
          if (0 < (int)uVar9) {
            uVar12 = uVar9;
          }
          uVar12 = uVar12 >> 2;
LAB_00569782:
          uVar9 = ~uVar12;
        }
        else {
          uVar9 = uVar9 >> 2;
        }
      }
      else if (iVar13 == 2) {
        if ((int)uVar9 < 0) {
          uVar9 = uVar9 + 1;
          uVar12 = -uVar9;
          if (0 < (int)uVar9) {
            uVar12 = uVar9;
          }
          uVar12 = uVar12 >> 1;
          goto LAB_00569782;
        }
        uVar9 = uVar9 >> 1;
      }
      else if ((int)uVar9 < 0) {
        iVar11 = uVar9 + 1;
        iVar10 = -iVar11;
        if (0 < iVar11) {
          iVar10 = iVar11;
        }
        uVar9 = ~(iVar10 / iVar13);
      }
      else {
        uVar9 = (int)uVar9 / iVar13;
      }
    }
  }
  else {
    local_54[0] = 0;
    local_54[1] = 0;
    local_54[2] = 0;
    lVar15 = 0;
    do {
      if (((uVar9 >> ((uint)lVar15 & 0x1f) & 1) != 0) &&
         (pIVar1->vect[lVar15] % local_48[lVar15] != 0)) {
        local_54[lVar15] = 1;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    uVar12 = pIVar1->vect[0];
    if (iVar8 != 1) {
      if (iVar8 == 4) {
        if ((int)uVar12 < 0) {
          uVar12 = uVar12 + 1;
          uVar9 = -uVar12;
          if (0 < (int)uVar12) {
            uVar9 = uVar12;
          }
          uVar9 = uVar9 >> 2;
LAB_005694eb:
          uVar12 = ~uVar9;
        }
        else {
          uVar12 = uVar12 >> 2;
        }
      }
      else if (iVar8 == 2) {
        if ((int)uVar12 < 0) {
          uVar12 = uVar12 + 1;
          uVar9 = -uVar12;
          if (0 < (int)uVar12) {
            uVar9 = uVar12;
          }
          uVar9 = uVar9 >> 1;
          goto LAB_005694eb;
        }
        uVar12 = uVar12 >> 1;
      }
      else if ((int)uVar12 < 0) {
        iVar11 = uVar12 + 1;
        iVar10 = -iVar11;
        if (0 < iVar11) {
          iVar10 = iVar11;
        }
        uVar12 = ~(iVar10 / iVar8);
      }
      else {
        uVar12 = (int)uVar12 / iVar8;
      }
    }
    (__return_storage_ptr__->bigend).vect[0] = uVar12;
    uVar17 = (__return_storage_ptr__->bigend).vect[1];
    if (local_48[1] != 1) {
      if (local_48[1] == 4) {
        if ((int)uVar17 < 0) {
          uVar17 = uVar17 + 1;
          uVar9 = -uVar17;
          if (0 < (int)uVar17) {
            uVar9 = uVar17;
          }
          uVar9 = uVar9 >> 2;
LAB_0056955d:
          uVar17 = ~uVar9;
        }
        else {
          uVar17 = uVar17 >> 2;
        }
      }
      else if (local_48[1] == 2) {
        if ((int)uVar17 < 0) {
          uVar17 = uVar17 + 1;
          uVar9 = -uVar17;
          if (0 < (int)uVar17) {
            uVar9 = uVar17;
          }
          uVar9 = uVar9 >> 1;
          goto LAB_0056955d;
        }
        uVar17 = uVar17 >> 1;
      }
      else if ((int)uVar17 < 0) {
        iVar11 = uVar17 + 1;
        iVar10 = -iVar11;
        if (0 < iVar11) {
          iVar10 = iVar11;
        }
        uVar17 = ~(iVar10 / local_48[1]);
      }
      else {
        uVar17 = (int)uVar17 / local_48[1];
      }
    }
    (__return_storage_ptr__->bigend).vect[1] = uVar17;
    uVar9 = (__return_storage_ptr__->bigend).vect[2];
    if (iVar13 != 1) {
      if (iVar13 == 4) {
        if ((int)uVar9 < 0) {
          uVar9 = uVar9 + 1;
          uVar14 = -uVar9;
          if (0 < (int)uVar9) {
            uVar14 = uVar9;
          }
          uVar14 = uVar14 >> 2;
LAB_005695c4:
          uVar9 = ~uVar14;
        }
        else {
          uVar9 = uVar9 >> 2;
        }
      }
      else if (iVar13 == 2) {
        if ((int)uVar9 < 0) {
          uVar9 = uVar9 + 1;
          uVar14 = -uVar9;
          if (0 < (int)uVar9) {
            uVar14 = uVar9;
          }
          uVar14 = uVar14 >> 1;
          goto LAB_005695c4;
        }
        uVar9 = uVar9 >> 1;
      }
      else if ((int)uVar9 < 0) {
        iVar11 = uVar9 + 1;
        iVar10 = -iVar11;
        if (0 < iVar11) {
          iVar10 = iVar11;
        }
        uVar9 = ~(iVar10 / iVar13);
      }
      else {
        uVar9 = (int)uVar9 / iVar13;
      }
    }
    (__return_storage_ptr__->bigend).vect[2] = uVar9;
    (__return_storage_ptr__->bigend).vect[0] = uVar12 + local_54[0];
    (__return_storage_ptr__->bigend).vect[1] = uVar17 + local_54[1];
    uVar9 = uVar9 + local_54[2];
  }
  (__return_storage_ptr__->bigend).vect[2] = uVar9;
LAB_005695f7:
  uVar9 = 0;
  switch((this->m_bat).m_bat_type) {
  case null:
  case coarsenRatio:
    break;
  case indexType:
  case indexType_coarsenRatio:
    uVar9 = *(uint *)&(this->m_bat).m_op;
    break;
  default:
    uVar9 = *(uint *)((long)&(this->m_bat).m_op + 4);
  }
  lVar15 = 0;
  do {
    uVar17 = 1 << ((byte)lVar15 & 0x1f);
    uVar12 = (uint)lVar15;
    (__return_storage_ptr__->bigend).vect[lVar15] =
         ((__return_storage_ptr__->bigend).vect[lVar15] +
         (uint)((uVar9 >> (uVar12 & 0x1f) & 1) != 0)) -
         (uint)(((__return_storage_ptr__->btype).itype >> (uVar12 & 0x1f) & 1) != 0);
    if ((uVar9 >> (uVar12 & 0x1f) & 1) == 0) {
      uVar17 = ~uVar17 & (__return_storage_ptr__->btype).itype;
    }
    else {
      uVar17 = uVar17 | (__return_storage_ptr__->btype).itype;
    }
    (__return_storage_ptr__->btype).itype = uVar17;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  *local_38 = (lVar19 / (long)(iVar8 * iVar13 * local_48[1])) / (long)(int)uVar18;
  return __return_storage_ptr__;
}

Assistant:

Box
BoxArray::minimalBox (Long& npts_avg_box) const
{
    BL_ASSERT(m_bat.is_simple());
    Box minbox;
    const int N = size();
    Long npts_tot = 0;
    if (N > 0)
    {
#ifdef AMREX_USE_OMP
        bool use_single_thread = omp_in_parallel();
        const int nthreads = use_single_thread ? 1 : omp_get_max_threads();
#else
        bool use_single_thread = true;
        const int nthreads = 1;
#endif
        if (use_single_thread)
        {
            minbox = m_ref->m_abox[0];
            npts_tot += m_ref->m_abox[0].numPts();
            for (int i = 1; i < N; ++i) {
                minbox.minBox(m_ref->m_abox[i]);
                npts_tot += m_ref->m_abox[i].numPts();
            }
        }
        else
        {
            Vector<Box> bxs(nthreads, m_ref->m_abox[0]);
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(+:npts_tot)
#endif
            {
                int tid = OpenMP::get_thread_num();
#ifdef AMREX_USE_OMP
#pragma omp for
#endif
                for (int i = 0; i < N; ++i) {
                    bxs[tid].minBox(m_ref->m_abox[i]);
                    Long npts = m_ref->m_abox[i].numPts();
                    npts_tot += npts;
                }
            }
            minbox = bxs[0];
            for (int i = 1; i < nthreads; ++i) {
                minbox.minBox(bxs[i]);
            }
        }
    }
    auto cr = crseRatio();
    minbox.coarsen(cr).convert(ixType());
    npts_tot /= AMREX_D_TERM(cr[0],*cr[1],*cr[2]);
    npts_avg_box = npts_tot / N;
    return minbox;
}